

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolk.c
# Opt level: O3

int ffgsvk(fitsfile *fptr,int colnum,int naxis,long *naxes,long *blc,long *trc,long *inc,int nulval,
          int *array,int *anynul,int *status)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  LONGLONG LVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int *array_00;
  long lVar13;
  long lVar14;
  bool bVar15;
  int local_3d0;
  char ldummy;
  long local_3c8;
  long local_3c0;
  long local_3b8;
  long local_3b0;
  long local_3a8;
  long local_3a0;
  int hdutype;
  long local_390;
  long local_388;
  long local_380;
  long local_378;
  long local_370;
  long local_368;
  long local_360;
  long local_358;
  long local_350;
  long local_348;
  long local_340;
  long local_338;
  long local_330;
  long local_328;
  long local_320;
  long local_318;
  long local_310;
  fitsfile *local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  long local_248;
  long local_240;
  long local_238;
  long local_230;
  long local_228;
  long local_220;
  LONGLONG dsize [10];
  long dir [9];
  long str [9];
  long incr [9];
  long stp [9];
  LONGLONG blcll [9];
  
  if (naxis - 10U < 0xfffffff7) {
    snprintf((char *)blcll,0x51,"NAXIS = %d in call to ffgsvj is out of range",(ulong)(uint)naxis);
    ffpmsg((char *)blcll);
    *status = 0x140;
    return 0x140;
  }
  iVar1 = fits_is_compressed_image(fptr,status);
  if (iVar1 != 0) {
    memcpy(blcll,blc,(ulong)(uint)(naxis << 3));
    memcpy(dsize,trc,(ulong)(uint)(naxis << 3));
    str[0]._0_4_ = nulval;
    fits_read_compressed_img(fptr,0x1f,blcll,dsize,inc,1,str,array,(char *)0x0,anynul,status);
    return *status;
  }
  iVar1 = ffghdt(fptr,&hdutype,status);
  if (0 < iVar1) goto LAB_001668e1;
  uVar2 = (ulong)(uint)naxis;
  if (hdutype == 0) {
    local_278 = (long)(int)(colnum + (uint)(colnum == 0));
    local_3d0 = 2;
    local_3c0 = 1;
    local_3c8 = local_278;
  }
  else {
    local_278 = trc[uVar2];
    local_3c0 = inc[uVar2];
    local_3d0 = colnum;
    local_3c8 = blc[uVar2];
  }
  if (anynul != (int *)0x0) {
    *anynul = 0;
  }
  lVar3 = 0;
  do {
    str[lVar3] = 1;
    stp[lVar3] = 1;
    incr[lVar3] = 1;
    dsize[lVar3] = 1;
    dir[lVar3] = 1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 9);
  local_308 = fptr;
  if (naxis == 0) {
    dsize[uVar2] = dir[uVar2] * dsize[uVar2];
LAB_00166ab4:
    lVar3 = ((stp[0] - CONCAT44(str[0]._4_4_,(int)str[0])) * dir[0]) / *inc;
    local_310 = dir[0] * incr[0];
  }
  else {
    uVar4 = 1;
    do {
      lVar3 = trc[uVar4 - 1];
      lVar9 = blc[uVar4 - 1];
      if (lVar3 < lVar9) {
        if (hdutype != 0) {
          snprintf((char *)blcll,0x51,"ffgsvk: illegal range specified for axis %ld");
          ffpmsg((char *)blcll);
          *status = 0x141;
          return 0x141;
        }
        dsize[uVar4 + 9] = -1;
        LVar8 = -1;
      }
      else {
        LVar8 = dsize[uVar4 + 9];
      }
      str[uVar4 - 1] = lVar9;
      stp[uVar4 - 1] = lVar3;
      incr[uVar4 - 1] = inc[uVar4 - 1];
      lVar3 = dsize[uVar4 - 1];
      dsize[uVar4] = naxes[uVar4 - 1] * lVar3;
      dsize[uVar4 - 1] = LVar8 * lVar3;
      bVar15 = uVar4 != uVar2;
      uVar4 = uVar4 + 1;
    } while (bVar15);
    dsize[uVar2] = dir[uVar2] * dsize[uVar2];
    if ((naxis != 1) || (*naxes != 1)) goto LAB_00166ab4;
    lVar3 = (local_278 - local_3c8) / local_3c0;
    local_310 = local_3c0;
    local_278 = local_3c8;
  }
  if (local_3c8 <= local_278) {
    local_360 = dir[8] * str[8];
    local_358 = stp[8] * dir[8];
    lVar5 = dir[7] * str[7];
    local_350 = stp[7] * dir[7];
    lVar10 = dir[6] * str[6];
    local_348 = stp[6] * dir[6];
    lVar7 = dir[5] * str[5];
    local_340 = stp[5] * dir[5];
    lVar9 = dir[4] * str[4];
    local_338 = stp[4] * dir[4];
    lVar13 = dir[3] * str[3];
    local_330 = stp[3] * dir[3];
    local_270 = dir[2] * str[2];
    local_318 = stp[2] * dir[2];
    local_240 = dir[1] * str[1];
    local_300 = stp[1] * dir[1];
    local_2f8 = (str[1] + -1) * dir[1] * dsize[1] +
                (str[2] + -1) * dir[2] * dsize[2] + (str[3] + -1) * dir[3] * dsize[3] +
                (str[4] + -1) * dir[4] * dsize[4] +
                (str[5] + -1) * dir[5] * dsize[5] +
                (str[6] + -1) * dir[6] * dsize[6] + (str[7] + -1) * dir[7] * dsize[7] +
                (str[8] + -1) * dir[8] * dsize[8] + CONCAT44(str[0]._4_4_,(int)str[0]);
    local_220 = lVar3 * 4 + 4;
    local_2f0 = incr[8];
    local_3b8 = dsize[8] * incr[8];
    local_2e8 = incr[7];
    local_2e0 = dsize[7] * incr[7];
    local_2d8 = incr[6];
    local_2d0 = dsize[6] * incr[6];
    local_2c8 = incr[5];
    local_2c0 = dsize[5] * incr[5];
    local_2b8 = incr[4];
    local_2b0 = dsize[4] * incr[4];
    local_298 = incr[3];
    local_290 = dsize[3] * incr[3];
    local_268 = incr[2];
    local_260 = dsize[2] * incr[2];
    local_228 = incr[1];
    local_3a0 = dsize[1] * incr[1];
    lVar6 = 0;
    local_328 = lVar9;
    local_320 = lVar5;
    local_258 = lVar13;
    local_250 = lVar7;
    local_248 = lVar10;
    do {
      if (local_360 <= local_358) {
        local_390 = local_360;
        lVar12 = local_2f8;
        do {
          local_2a8 = lVar12;
          local_388 = lVar5;
          local_2a0 = lVar12;
          if (lVar5 <= local_350) {
            do {
              lVar14 = local_2a8;
              local_380 = lVar10;
              local_288 = local_2a8;
              if (lVar10 <= local_348) {
                do {
                  lVar11 = local_2a8;
                  local_378 = lVar7;
                  local_280 = local_2a8;
                  if (lVar7 <= local_340) {
                    do {
                      local_3b0 = local_2a8;
                      local_370 = lVar9;
                      if (lVar9 <= local_338) {
                        do {
                          if (lVar13 <= local_330) {
                            local_3a8 = local_3b0;
                            local_368 = lVar13;
                            do {
                              local_238 = local_270;
                              lVar12 = local_3a8;
                              if (local_270 <= local_318) {
                                do {
                                  local_230 = lVar12;
                                  if (local_240 <= local_300) {
                                    array_00 = array + lVar6;
                                    lVar9 = local_240;
                                    do {
                                      iVar1 = ffgclk(fptr,local_3d0,local_3c8,lVar12,lVar3 + 1,
                                                     local_310,1,nulval,array_00,&ldummy,
                                                     (int *)blcll,status);
                                      if (0 < iVar1) {
                                        return *status;
                                      }
                                      if ((anynul != (int *)0x0) && ((int)blcll[0] != 0)) {
                                        *anynul = 1;
                                      }
                                      lVar6 = lVar6 + lVar3 + 1;
                                      array_00 = (int *)((long)array_00 + local_220);
                                      lVar9 = lVar9 + local_228;
                                      lVar12 = lVar12 + local_3a0;
                                      fptr = local_308;
                                    } while (lVar9 <= local_300);
                                  }
                                  local_238 = local_238 + local_268;
                                  lVar9 = local_328;
                                  lVar13 = local_258;
                                  lVar7 = local_250;
                                  lVar10 = local_248;
                                  lVar12 = local_230 + local_260;
                                  lVar5 = local_320;
                                } while (local_238 <= local_318);
                              }
                              local_368 = local_368 + local_298;
                              local_3a8 = local_3a8 + local_290;
                              lVar11 = local_280;
                              lVar12 = local_2a0;
                              lVar14 = local_288;
                            } while (local_368 <= local_330);
                          }
                          local_370 = local_370 + local_2b8;
                          local_3b0 = local_3b0 + local_2b0;
                        } while (local_370 <= local_338);
                      }
                      local_378 = local_378 + local_2c8;
                      local_2a8 = local_2a8 + local_2c0;
                    } while (local_378 <= local_340);
                  }
                  local_380 = local_380 + local_2d8;
                  local_2a8 = lVar11 + local_2d0;
                } while (local_380 <= local_348);
              }
              local_388 = local_388 + local_2e8;
              local_2a8 = lVar14 + local_2e0;
            } while (local_388 <= local_350);
          }
          local_390 = local_390 + local_2f0;
          lVar12 = lVar12 + local_3b8;
        } while (local_390 <= local_358);
      }
      local_3c8 = local_3c8 + local_3c0;
    } while (local_3c8 <= local_278);
  }
LAB_001668e1:
  return *status;
}

Assistant:

int ffgsvk(fitsfile *fptr, /* I - FITS file pointer                         */
           int  colnum,    /* I - number of the column to read (1 = 1st)    */
           int naxis,      /* I - number of dimensions in the FITS array    */
           long  *naxes,   /* I - size of each dimension                    */
           long  *blc,     /* I - 'bottom left corner' of the subsection    */
           long  *trc,     /* I - 'top right corner' of the subsection      */
           long  *inc,     /* I - increment to be applied in each dimension */
           int  nulval,    /* I - value to set undefined pixels             */
           int  *array,    /* O - array to be filled and returned           */
           int  *anynul,   /* O - set to 1 if any values are null; else 0   */
           int  *status)   /* IO - error status                             */
/*
  Read a subsection of data values from an image or a table column.
  This routine is set up to handle a maximum of nine dimensions.
*/
{
    long ii,i0, i1,i2,i3,i4,i5,i6,i7,i8,row,rstr,rstp,rinc;
    long str[9],stp[9],incr[9],dir[9];
    long nelem, nultyp, ninc, numcol;
    LONGLONG felem, dsize[10], blcll[9], trcll[9];
    int hdutype, anyf;
    char ldummy, msg[FLEN_ERRMSG];
    int nullcheck = 1;
    int nullvalue;

    if (naxis < 1 || naxis > 9)
    {
        snprintf(msg, FLEN_ERRMSG,"NAXIS = %d in call to ffgsvj is out of range", naxis);
        ffpmsg(msg);
        return(*status = BAD_DIMEN);
    }

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        for (ii=0; ii < naxis; ii++) {
	    blcll[ii] = blc[ii];
	    trcll[ii] = trc[ii];
	}

        nullvalue = nulval;  /* set local variable */

        fits_read_compressed_img(fptr, TINT, blcll, trcll, inc,
            nullcheck, &nullvalue, array, NULL, anynul, status);
        return(*status);
    }

/*
    if this is a primary array, then the input COLNUM parameter should
    be interpreted as the row number, and we will alway read the image
    data from column 2 (any group parameters are in column 1).
*/
    if (ffghdt(fptr, &hdutype, status) > 0)
        return(*status);

    if (hdutype == IMAGE_HDU)
    {
        /* this is a primary array, or image extension */
        if (colnum == 0)
        {
            rstr = 1;
            rstp = 1;
        }
        else
        {
            rstr = colnum;
            rstp = colnum;
        }
        rinc = 1;
        numcol = 2;
    }
    else
    {
        /* this is a table, so the row info is in the (naxis+1) elements */
        rstr = blc[naxis];
        rstp = trc[naxis];
        rinc = inc[naxis];
        numcol = colnum;
    }

    nultyp = 1;
    if (anynul)
        *anynul = FALSE;

    i0 = 0;
    for (ii = 0; ii < 9; ii++)
    {
        str[ii] = 1;
        stp[ii] = 1;
        incr[ii] = 1;
        dsize[ii] = 1;
        dir[ii] = 1;
    }

    for (ii = 0; ii < naxis; ii++)
    {
      if (trc[ii] < blc[ii])
      {
        if (hdutype == IMAGE_HDU)
        {
           dir[ii] = -1;
        }
        else
        {
          snprintf(msg, FLEN_ERRMSG,"ffgsvk: illegal range specified for axis %ld", ii + 1);
          ffpmsg(msg);
          return(*status = BAD_PIX_NUM);
        }
      }

      str[ii] = blc[ii];
      stp[ii] = trc[ii];
      incr[ii] = inc[ii];
      dsize[ii + 1] = dsize[ii] * naxes[ii];
      dsize[ii] = dsize[ii] * dir[ii];
    }
    dsize[naxis] = dsize[naxis] * dir[naxis];

    if (naxis == 1 && naxes[0] == 1)
    {
      /* This is not a vector column, so read all the rows at once */
      nelem = (rstp - rstr) / rinc + 1;
      ninc = rinc;
      rstp = rstr;
    }
    else
    {
      /* have to read each row individually, in all dimensions */
      nelem = (stp[0]*dir[0] - str[0]*dir[0]) / inc[0] + 1;
      ninc = incr[0] * dir[0];
    }

    for (row = rstr; row <= rstp; row += rinc)
    {
     for (i8 = str[8]*dir[8]; i8 <= stp[8]*dir[8]; i8 += incr[8])
     {
      for (i7 = str[7]*dir[7]; i7 <= stp[7]*dir[7]; i7 += incr[7])
      {
       for (i6 = str[6]*dir[6]; i6 <= stp[6]*dir[6]; i6 += incr[6])
       {
        for (i5 = str[5]*dir[5]; i5 <= stp[5]*dir[5]; i5 += incr[5])
        {
         for (i4 = str[4]*dir[4]; i4 <= stp[4]*dir[4]; i4 += incr[4])
         {
          for (i3 = str[3]*dir[3]; i3 <= stp[3]*dir[3]; i3 += incr[3])
          {
           for (i2 = str[2]*dir[2]; i2 <= stp[2]*dir[2]; i2 += incr[2])
           {
            for (i1 = str[1]*dir[1]; i1 <= stp[1]*dir[1]; i1 += incr[1])
            {

              felem=str[0] + (i1 - dir[1]) * dsize[1] + (i2 - dir[2]) * dsize[2] + 
                             (i3 - dir[3]) * dsize[3] + (i4 - dir[4]) * dsize[4] +
                             (i5 - dir[5]) * dsize[5] + (i6 - dir[6]) * dsize[6] +
                             (i7 - dir[7]) * dsize[7] + (i8 - dir[8]) * dsize[8];

              if ( ffgclk(fptr, numcol, row, felem, nelem, ninc, nultyp,
                   nulval, &array[i0], &ldummy, &anyf, status) > 0)
                   return(*status);

              if (anyf && anynul)
                  *anynul = TRUE;

              i0 += nelem;
            }
           }
          }
         }
        }
       }
      }
     }
    }
    return(*status);
}